

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O2

void __thiscall
DeviceGroup::init<AudioEnumerator>
          (DeviceGroup *this,AudioEnumerator *enumerator,int backend,int device)

{
  QComboBox *this_00;
  QLabel *pQVar1;
  bool bVar2;
  QArrayDataPointer<QString> QStack_48;
  
  this_00 = this->mApiCombo;
  AudioEnumerator::backendNames((QStringList *)&QStack_48,enumerator);
  QComboBox::addItems(this_00,(QStringList *)&QStack_48);
  QArrayDataPointer<QString>::~QArrayDataPointer(&QStack_48);
  QComboBox::setCurrentIndex((int)this->mApiCombo);
  populateDevices<AudioEnumerator>(this,enumerator);
  QComboBox::setCurrentIndex((int)this->mDeviceCombo);
  pQVar1 = this->mErrorLabel;
  bVar2 = AudioEnumerator::backendIsAvailable(enumerator,backend);
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,!bVar2);
  return;
}

Assistant:

void init(Enumerator const& enumerator, int backend, int device) {
        mApiCombo->addItems(enumerator.backendNames());
        mApiCombo->setCurrentIndex(backend);
        populateDevices(enumerator);
        mDeviceCombo->setCurrentIndex(device);
        mErrorLabel->setVisible(!enumerator.backendIsAvailable(backend));
    }